

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::TextureGather2DArrayInstance
          (TextureGather2DArrayInstance *this,Context *context,GatherCaseBaseParams *baseParams,
          IVec3 *textureSize,
          vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
          *iterations)

{
  TextureFormat *format;
  TextureFormat local_44 [2];
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  *local_30;
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  *iterations_local;
  IVec3 *textureSize_local;
  GatherCaseBaseParams *baseParams_local;
  Context *context_local;
  TextureGather2DArrayInstance *this_local;
  
  local_30 = iterations;
  iterations_local =
       (vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
        *)textureSize;
  textureSize_local = (IVec3 *)baseParams;
  baseParams_local = (GatherCaseBaseParams *)context;
  context_local = (Context *)this;
  TextureGatherInstance::TextureGatherInstance
            (&this->super_TextureGatherInstance,context,baseParams);
  (this->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__TextureGather2DArrayInstance_016661a0;
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)&(this->super_TextureGatherInstance).field_0x264,
             (Vector<int,_3> *)iterations_local);
  std::
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  ::vector(&this->m_iterations,local_30);
  tcu::TextureFormat::TextureFormat(local_44);
  format = local_44;
  tcu::Texture2DArray::Texture2DArray(&this->m_swizzledTexture,format,1,1,1);
  TextureGatherInstance::init(&this->super_TextureGatherInstance,(EVP_PKEY_CTX *)format);
  return;
}

Assistant:

TextureGather2DArrayInstance::TextureGather2DArrayInstance (Context&							context,
															const GatherCaseBaseParams&			baseParams,
															const IVec3&						textureSize,
															const vector<Gather2DArrayArgs>&	iterations)
	: TextureGatherInstance		(context, baseParams)
	, m_textureSize				(textureSize)
	, m_iterations				(iterations)
	, m_swizzledTexture			(tcu::TextureFormat(), 1, 1, 1)
{
	init();
}